

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O0

CMutableTransaction *
wallet::wallet_tests::TestSimpleSpend(CTransaction *from,uint32_t index,CKey *key,CScript *pubkey)

{
  long lVar1;
  Txid hashPrevTx;
  bool bVar2;
  const_reference pvVar3;
  long lVar4;
  Txid *pTVar5;
  undefined8 in_RCX;
  CMutableTransaction *in_RDI;
  undefined8 in_R8;
  long in_FS_OFFSET;
  CMutableTransaction *mtx;
  map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
  input_errors;
  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  coins;
  FillableSigningProvider keystore;
  CTransaction *in_stack_fffffffffffffd08;
  FillableSigningProvider *this;
  size_type in_stack_fffffffffffffd10;
  CTxOut *prev;
  CScript *in_stack_fffffffffffffd18;
  CTxOut *this_00;
  long *in_stack_fffffffffffffd20;
  key_type *in_stack_fffffffffffffd28;
  FillableSigningProvider *in_stack_fffffffffffffd30;
  undefined7 in_stack_fffffffffffffd38;
  undefined1 in_stack_fffffffffffffd3f;
  const_string *file;
  undefined8 in_stack_fffffffffffffd48;
  uint32_t nSequenceIn;
  CScript *in_stack_fffffffffffffd50;
  undefined8 in_stack_fffffffffffffd58;
  uint32_t nOut;
  CTxIn *in_stack_fffffffffffffd60;
  undefined1 in_stack_fffffffffffffda0 [15];
  undefined1 uVar6;
  byte bVar7;
  const_string local_228 [2];
  lazy_ostream local_208 [2];
  map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
  *in_stack_fffffffffffffe48;
  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  *in_stack_fffffffffffffe58;
  SigningProvider *in_stack_fffffffffffffe60;
  CMutableTransaction *in_stack_fffffffffffffe68;
  
  nOut = (uint32_t)((ulong)in_stack_fffffffffffffd58 >> 0x20);
  nSequenceIn = (uint32_t)((ulong)in_stack_fffffffffffffd48 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = 0;
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffffd08);
  pvVar3 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffd18,
                      in_stack_fffffffffffffd10);
  lVar4 = pvVar3->nValue + -10000000;
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<long,CScript_const&>
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffd28,
             in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  pTVar5 = CTransaction::GetHash(in_stack_fffffffffffffd08);
  this = *(FillableSigningProvider **)(pTVar5->m_wrapped).super_base_blob<256U>.m_data._M_elems;
  prev = *(CTxOut **)((pTVar5->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
  this_00 = *(CTxOut **)((pTVar5->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
  CScript::CScript((CScript *)in_stack_fffffffffffffd08);
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = uVar6;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = in_stack_fffffffffffffda0[0];
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = in_stack_fffffffffffffda0[1];
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = in_stack_fffffffffffffda0[2];
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = in_stack_fffffffffffffda0[3];
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = in_stack_fffffffffffffda0[4];
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = in_stack_fffffffffffffda0[5];
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = in_stack_fffffffffffffda0[6];
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = in_stack_fffffffffffffda0[7];
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = in_stack_fffffffffffffda0[8];
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = in_stack_fffffffffffffda0[9];
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = in_stack_fffffffffffffda0[10];
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = in_stack_fffffffffffffda0[0xb];
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = in_stack_fffffffffffffda0[0xc];
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = in_stack_fffffffffffffda0[0xd];
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = in_stack_fffffffffffffda0[0xe];
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = (char)in_R8;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = (char)((ulong)in_R8 >> 8);
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = (char)((ulong)in_R8 >> 0x10);
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = (char)((ulong)in_R8 >> 0x18);
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = (char)((ulong)in_R8 >> 0x20);
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = (char)((ulong)in_R8 >> 0x28);
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = (char)((ulong)in_R8 >> 0x30);
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = (char)((ulong)in_R8 >> 0x38);
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = (char)in_RCX;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] = (char)((ulong)in_RCX >> 8);
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] = (char)((ulong)in_RCX >> 0x10);
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] = (char)((ulong)in_RCX >> 0x18);
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] = (char)((ulong)in_RCX >> 0x20);
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] = (char)((ulong)in_RCX >> 0x28);
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] = (char)((ulong)in_RCX >> 0x30);
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] = (char)((ulong)in_RCX >> 0x38);
  CTxIn::CTxIn(in_stack_fffffffffffffd60,hashPrevTx,nOut,in_stack_fffffffffffffd50,nSequenceIn);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::push_back
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)this,(value_type *)0xe3ab14);
  CTxIn::~CTxIn((CTxIn *)this);
  CScript::~CScript((CScript *)this);
  FillableSigningProvider::FillableSigningProvider(this);
  FillableSigningProvider::AddKey(in_stack_fffffffffffffd30,(CKey *)in_stack_fffffffffffffd28);
  std::
  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>::
  map((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
       *)this);
  pvVar3 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)this_00,(size_type)prev);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)this_00,(size_type)prev);
  std::
  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>::
  operator[]((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
              *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  CTxOut::operator=(this_00,prev);
  std::
  map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>::
  map((map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
       *)this);
  do {
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_00,(pointer)prev,(unsigned_long)this);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)pvVar3,file,
               CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
               (const_string *)in_stack_fffffffffffffd30);
    in_stack_fffffffffffffd3f =
         SignTransaction(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
                         in_stack_fffffffffffffe58,(int)((ulong)lVar4 >> 0x20),
                         in_stack_fffffffffffffe48);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)this_00,SUB81((ulong)prev >> 0x38,0));
    in_stack_fffffffffffffd30 =
         (FillableSigningProvider *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_00,(pointer)prev,(unsigned_long)this);
    boost::unit_test::operator<<((lazy_ostream *)prev,(basic_cstring<const_char> *)this);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_00,(pointer)prev,(unsigned_long)this);
    this = (FillableSigningProvider *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&stack0xfffffffffffffe18,local_208,local_228,0x3b,CHECK,
               CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  bVar7 = 1;
  std::
  map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>::
  ~map((map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
        *)this);
  std::
  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>::
  ~map((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
        *)this);
  FillableSigningProvider::~FillableSigningProvider(this);
  if ((bVar7 & 1) == 0) {
    CMutableTransaction::~CMutableTransaction((CMutableTransaction *)this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static CMutableTransaction TestSimpleSpend(const CTransaction& from, uint32_t index, const CKey& key, const CScript& pubkey)
{
    CMutableTransaction mtx;
    mtx.vout.emplace_back(from.vout[index].nValue - DEFAULT_TRANSACTION_MAXFEE, pubkey);
    mtx.vin.push_back({CTxIn{from.GetHash(), index}});
    FillableSigningProvider keystore;
    keystore.AddKey(key);
    std::map<COutPoint, Coin> coins;
    coins[mtx.vin[0].prevout].out = from.vout[index];
    std::map<int, bilingual_str> input_errors;
    BOOST_CHECK(SignTransaction(mtx, &keystore, coins, SIGHASH_ALL, input_errors));
    return mtx;
}